

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

ssl_private_key_result_t
AsyncPrivateKeyDecrypt
          (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  int iVar4;
  ssl_private_key_result_t sVar5;
  TestState *pTVar6;
  SSL *ssl_00;
  RSA *rsa;
  void *pvVar7;
  SSL_CREDENTIAL *cred;
  UniquePtr<EVP_PKEY> *pUVar8;
  size_t sVar9;
  long lVar10;
  long *extraout_RDX;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t *puVar11;
  SSL *ssl_01;
  
  sVar9 = max_out;
  puVar11 = out;
  ssl_00 = (SSL *)ssl;
  pTVar6 = GetTestState(ssl);
  pTVar6->used_private_key = true;
  if ((pTVar6->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pTVar6->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ssl_00 = (SSL *)GetPrivateKey(ssl);
    rsa = EVP_PKEY_get0_RSA((EVP_PKEY *)ssl_00);
    if (rsa != (RSA *)0x0) {
      this = &pTVar6->private_key_result;
      uVar3 = RSA_size((RSA *)rsa);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(ulong)uVar3);
      puVar11 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = RSA_size((RSA *)rsa);
      iVar4 = RSA_decrypt(rsa,out_len,puVar11,(ulong)uVar3,in,in_len,3);
      if (iVar4 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,*out_len);
        sVar5 = AsyncPrivateKeyComplete(ssl,out,out_len,max_out);
        return sVar5;
      }
      return ssl_private_key_failure;
    }
  }
  else {
    AsyncPrivateKeyDecrypt();
  }
  AsyncPrivateKeyDecrypt();
  ssl_01 = ssl_00;
  pTVar6 = GetTestState((SSL *)ssl_00);
  if ((pTVar6->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pTVar6->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    AsyncPrivateKeyComplete();
    cred = SSL_get0_selected_credential((SSL *)ssl_01);
    iVar4 = CredentialInfoExDataIndex();
    pvVar7 = SSL_CREDENTIAL_get_ex_data(cred,iVar4);
    if (pvVar7 == (void *)0x0) {
      pTVar6 = GetTestState((SSL *)ssl_01);
      pUVar8 = &pTVar6->private_key;
    }
    else {
      pUVar8 = (UniquePtr<EVP_PKEY> *)((long)pvVar7 + 8);
    }
    return (ssl_private_key_result_t)
           (pUVar8->_M_t).super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
  }
  iVar4 = TestConfigExDataIndex();
  pvVar7 = SSL_get_ex_data(ssl_00,iVar4);
  if ((*(char *)((long)pvVar7 + 0x269) != '\x01') ||
     (sVar5 = ssl_private_key_retry, 1 < pTVar6->private_key_retries)) {
    puVar1 = (pTVar6->private_key_result).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pTVar6->private_key_result).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar2 - (long)puVar1;
    if (sVar9 < __n) {
      AsyncPrivateKeyComplete();
      sVar5 = ssl_private_key_failure;
    }
    else {
      if (puVar2 != puVar1) {
        memcpy(puVar11,puVar1,__n);
      }
      puVar1 = (pTVar6->private_key_result).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(pTVar6->private_key_result).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1;
      *extraout_RDX = lVar10;
      if (lVar10 != 0) {
        (pTVar6->private_key_result).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
      pTVar6->private_key_retries = 0;
      sVar5 = ssl_private_key_success;
    }
  }
  return sVar5;
}

Assistant:

static ssl_private_key_result_t AsyncPrivateKeyDecrypt(SSL *ssl, uint8_t *out,
                                                       size_t *out_len,
                                                       size_t max_out,
                                                       const uint8_t *in,
                                                       size_t in_len) {
  TestState *test_state = GetTestState(ssl);
  test_state->used_private_key = true;
  if (!test_state->private_key_result.empty()) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with operation pending.\n");
    abort();
  }

  EVP_PKEY *private_key = GetPrivateKey(ssl);
  RSA *rsa = EVP_PKEY_get0_RSA(private_key);
  if (rsa == NULL) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with incorrect key type.\n");
    abort();
  }
  test_state->private_key_result.resize(RSA_size(rsa));
  if (!RSA_decrypt(rsa, out_len, test_state->private_key_result.data(),
                   RSA_size(rsa), in, in_len, RSA_NO_PADDING)) {
    return ssl_private_key_failure;
  }

  test_state->private_key_result.resize(*out_len);

  return AsyncPrivateKeyComplete(ssl, out, out_len, max_out);
}